

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O3

matrix<int,_2UL> *
trng::operator*(matrix<int,_2UL> *__return_storage_ptr__,matrix<int,_2UL> *a,matrix<int,_2UL> *b)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  pointer piVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  
  piVar5 = (pointer)operator_new(0x10);
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = piVar5;
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar5 + 4;
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar5 + 4;
  piVar2 = (a->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (b->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5[0] = 0;
  piVar5[1] = 0;
  piVar5[2] = 0;
  piVar5[3] = 0;
  lVar7 = 0;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    lVar9 = 0;
    bVar4 = true;
    do {
      bVar8 = bVar4;
      piVar1 = (int *)((long)piVar5 + lVar9 * 4 + lVar7);
      *piVar1 = *piVar1 + piVar3[lVar9] * *(int *)((long)piVar2 + lVar7) +
                          piVar3[lVar9 + 2] * *(int *)((long)piVar2 + lVar7 + 4);
      lVar9 = 1;
      bVar4 = false;
    } while (bVar8);
    lVar7 = 8;
    bVar4 = false;
  } while (bVar6);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }